

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerThread.cxx
# Opt level: O0

bool testStackFrameFunctionName(void)

{
  element_type *this;
  reference pvVar1;
  ostream *poVar2;
  undefined1 local_f8 [8];
  StackTraceResponse stackTrace;
  string local_c8;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_a8;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  cmListFileFunction func;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> arguments;
  char *functionName;
  undefined1 local_20 [8];
  shared_ptr<cmDebugger::cmDebuggerThread> thread;
  
  functionName._4_4_ = 0;
  std::make_shared<cmDebugger::cmDebuggerThread,int,char_const(&)[5]>
            ((int *)local_20,(char (*) [5])((long)&functionName + 4));
  func.Impl.super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
             &func.Impl.
              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"function_name",&local_79);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
            (&local_a8,
             (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
             &func.Impl.
              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cmListFileFunction::cmListFileFunction((cmListFileFunction *)local_58,&local_78,10,0x14,&local_a8)
  ;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_a8);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  this = std::
         __shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMakeLists.txt",
             (allocator<char> *)&stackTrace.totalFrames.field_0xf);
  cmDebugger::cmDebuggerThread::PushStackFrame
            (this,(cmMakefile *)0x0,&local_c8,(cmListFileFunction *)local_58);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&stackTrace.totalFrames.field_0xf);
  cmDebugger::GetStackTraceResponse
            ((StackTraceResponse *)local_f8,(shared_ptr<cmDebugger::cmDebuggerThread> *)local_20);
  pvVar1 = std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>::operator[]
                     ((vector<dap::StackFrame,_std::allocator<dap::StackFrame>_> *)local_f8,0);
  thread.super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = std::operator==(&pvVar1->name,"function_name");
  if (!(bool)thread.super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._7_1_) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(stackTrace.stackFrames[0].name == functionName) failed on line "
                            );
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x18);
    std::operator<<(poVar2,"\n");
  }
  dap::StackTraceResponse::~StackTraceResponse((StackTraceResponse *)local_f8);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_58);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
             &func.Impl.
              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<cmDebugger::cmDebuggerThread>::~shared_ptr
            ((shared_ptr<cmDebugger::cmDebuggerThread> *)local_20);
  return (bool)(thread.super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._7_1_ & 1);
}

Assistant:

static bool testStackFrameFunctionName()
{
  auto thread = std::make_shared<cmDebugger::cmDebuggerThread>(0, "name");
  const auto* functionName = "function_name";
  auto arguments = std::vector<cmListFileArgument>{};
  cmListFileFunction func(functionName, 10, 20, arguments);
  thread->PushStackFrame(nullptr, "CMakeLists.txt", func);

  auto stackTrace = GetStackTraceResponse(thread);

  ASSERT_TRUE(stackTrace.stackFrames[0].name == functionName);
  return true;
}